

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall CoinSelection_Constructor_Test::TestBody(CoinSelection_Constructor_Test *this)

{
  bool bVar1;
  AssertHelper local_40;
  CoinSelection coin_select1;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::CoinSelection::CoinSelection(&coin_select1);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&coin_select1.randomize_cache_.super__Bvector_base<std::allocator<bool>_>);
    }
  }
  else {
    testing::Message::Message((Message *)&coin_select1);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x27b,
               "Expected: CoinSelection coin_select1 doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&coin_select1);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&coin_select1);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::CoinSelection::CoinSelection(&coin_select1,false);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&coin_select1.randomize_cache_.super__Bvector_base<std::allocator<bool>_>);
    }
  }
  else {
    testing::Message::Message((Message *)&coin_select1);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x27c,
               "Expected: CoinSelection coin_select2(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&coin_select1);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&coin_select1);
  }
  return;
}

Assistant:

TEST(CoinSelection, Constructor)
{
  EXPECT_NO_THROW(CoinSelection coin_select1);
  EXPECT_NO_THROW(CoinSelection coin_select2(false));
}